

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

string * __thiscall adios2::Engine::Name_abi_cxx11_(string *__return_storage_ptr__,Engine *this)

{
  Engine *pointer;
  allocator local_41;
  string local_40;
  
  pointer = this->m_Engine;
  std::__cxx11::string::string((string *)&local_40,"in call to Engine::Name",&local_41);
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(this->m_Engine + 0x30));
  return __return_storage_ptr__;
}

Assistant:

std::string Engine::Name() const
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::Name");
    return m_Engine->m_Name;
}